

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMU_PUBLIC_PARMS_Unmarshal
                 (TPMU_PUBLIC_PARMS *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_PUBLIC_PARMS *target_local;
  
  switch(selector) {
  case 1:
    target_local._4_4_ = TPMS_RSA_PARMS_Unmarshal(&target->rsaDetail,buffer,size);
    break;
  default:
    target_local._4_4_ = 0x98;
    break;
  case 8:
    target_local._4_4_ =
         TPMT_KEYEDHASH_SCHEME_Unmarshal(&(target->keyedHashDetail).scheme,buffer,size,1);
    break;
  case 0x23:
    target_local._4_4_ = TPMS_ECC_PARMS_Unmarshal(&target->eccDetail,buffer,size);
    break;
  case 0x25:
    target_local._4_4_ =
         TPMT_SYM_DEF_OBJECT_Unmarshal
                   ((TPMT_SYM_DEF_OBJECT *)&target->keyedHashDetail,buffer,size,0);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMU_PUBLIC_PARMS_Unmarshal(TPMU_PUBLIC_PARMS *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPMS_KEYEDHASH_PARMS_Unmarshal((TPMS_KEYEDHASH_PARMS *)&(target->keyedHashDetail), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPMS_SYMCIPHER_PARMS_Unmarshal((TPMS_SYMCIPHER_PARMS *)&(target->symDetail), buffer, size);
#endif // ALG_SYMCIPHER
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPMS_RSA_PARMS_Unmarshal((TPMS_RSA_PARMS *)&(target->rsaDetail), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPMS_ECC_PARMS_Unmarshal((TPMS_ECC_PARMS *)&(target->eccDetail), buffer, size);
#endif // ALG_ECC
    }
    return TPM_RC_SELECTOR;
}